

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O3

vector<bool,_std::allocator<bool>_> * __thiscall
EefcFlash::getLockRegions
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,EefcFlash *this)

{
  ulong *puVar1;
  _Bit_type *p_Var2;
  uint uVar3;
  uint32_t uVar4;
  ulong in_RAX;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(ulong)(this->super_Flash)._lockRegions,
             (bool *)((long)&uStack_38 + 7),(allocator_type *)((long)&uStack_38 + 6));
  waitFSR(this,1);
  uVar3 = (this->super_Flash)._lockRegions;
  if (uVar3 != 0) {
    uVar5 = 0;
    do {
      if (((this->super_Flash)._planes == 2) && (uVar7 = uVar5 - (uVar3 >> 1), uVar3 >> 1 <= uVar5))
      {
        Samba::writeWord((this->super_Flash)._samba,*(int *)&(this->super_Flash).field_0xf4 + 0x204,
                         0x5a00000a);
        waitFSR(this,1);
        uVar4 = Samba::readWord((this->super_Flash)._samba,
                                *(int *)&(this->super_Flash).field_0xf4 + 0x20c);
        for (; 0x1f < uVar7; uVar7 = uVar7 - 0x20) {
          uVar4 = Samba::readWord((this->super_Flash)._samba,
                                  *(int *)&(this->super_Flash).field_0xf4 + 0x20c);
        }
      }
      else {
        Samba::writeWord((this->super_Flash)._samba,*(int *)&(this->super_Flash).field_0xf4 + 4,
                         0x5a00000a);
        waitFSR(this,1);
        uVar4 = Samba::readWord((this->super_Flash)._samba,
                                *(int *)&(this->super_Flash).field_0xf4 + 0xc);
        for (uVar7 = uVar5; 0x1f < uVar7; uVar7 = uVar7 - 0x20) {
          uVar4 = Samba::readWord((this->super_Flash)._samba,
                                  *(int *)&(this->super_Flash).field_0xf4 + 0xc);
        }
      }
      p_Var2 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar6 = 1L << ((byte)uVar5 & 0x3f);
      if ((uVar4 >> (uVar7 & 0x1f) & 1) == 0) {
        puVar1 = p_Var2 + (uVar5 >> 6);
        *puVar1 = *puVar1 & ~uVar6;
      }
      else {
        puVar1 = p_Var2 + (uVar5 >> 6);
        *puVar1 = *puVar1 | uVar6;
      }
      uVar5 = uVar5 + 1;
      uVar3 = (this->super_Flash)._lockRegions;
    } while (uVar5 < uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool>
EefcFlash::getLockRegions()
{
    std::vector<bool> regions(_lockRegions);
    uint32_t frr;
    uint32_t bit;

    waitFSR();
    for (uint32_t region = 0; region < _lockRegions; region++)
    {
        if (_planes == 2 && region >= _lockRegions / 2)
        {
            bit = region - _lockRegions / 2;
            writeFCR1(EEFC_FCMD_GLB, 0);
            waitFSR();
            frr = readFRR1();
            while (bit >= 32)
            {
                frr = readFRR1();
                bit -= 32;
            }
            regions[region] = (frr & (1 << bit)) != 0;
        }
        else
        {
            bit = region;
            writeFCR0(EEFC_FCMD_GLB, 0);
            waitFSR();
            frr = readFRR0();
            while (bit >= 32)
            {
                frr = readFRR0();
                bit -= 32;
            }
            regions[region] = (frr & (1 << bit)) != 0;
        }
    }

    return regions;
}